

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O3

void __thiscall phyr::Sphere::~Sphere(Sphere *this)

{
  operator_delete(this);
  return;
}

Assistant:

Sphere(const Transform* localToWorld, const Transform* worldToLocal,
           Real radius, const bool reverseNormals = false,
           Real zMin = -Infinity, Real zMax = Infinity) :
           Shape(localToWorld, worldToLocal, reverseNormals) {
        this->radius = radius;
        // Clip z visibility
        this->zMin = clamp(std::min(zMin, zMax), -radius, radius);
        this->zMax = clamp(std::max(zMin, zMax), -radius, radius);

        // Theta can have values in the range [-1, 1]
        // subject to being clipped by the min and max z values
        thetaMin = std::acos(clamp(zMin / radius, -1, 1));
        thetaMax = std::acos(clamp(zMax / radius, -1, 1));
    }